

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O3

void __thiscall
FDrawInfo::AddOtherCeilingPlane(FDrawInfo *this,int sector,gl_subsectorrendernode *node)

{
  uint uVar1;
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*> *this_00;
  uint uVar2;
  gl_subsectorrendernode **ppgVar3;
  int iVar4;
  long lVar5;
  
  this_00 = &this->otherceilingplanes;
  uVar2 = (this->otherceilingplanes).Count;
  lVar5 = (long)(int)uVar2;
  if ((int)uVar2 <= sector) {
    uVar1 = sector + 1;
    if (uVar2 < uVar1) {
      TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Grow(this_00,uVar1 - uVar2);
    }
    (this->otherceilingplanes).Count = uVar1;
    iVar4 = (sector - uVar2) + 1;
    do {
      this_00->Array[lVar5] = (gl_subsectorrendernode *)0x0;
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  ppgVar3 = this_00->Array;
  node->next = ppgVar3[sector];
  ppgVar3[sector] = node;
  return;
}

Assistant:

void FDrawInfo::AddOtherCeilingPlane(int sector, gl_subsectorrendernode * node)
{
	int oldcnt = otherceilingplanes.Size();

	if (oldcnt<=sector)
	{
		otherceilingplanes.Resize(sector+1);
		for(int i=oldcnt;i<=sector;i++) otherceilingplanes[i]=NULL;
	}
	node->next = otherceilingplanes[sector];
	otherceilingplanes[sector] = node;
}